

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_node_leaflist
                 (lyd_lyb_ctx *lybctx,lyd_node *parent,lysc_node *snode,lyd_node **first_p,
                 ly_set *parsed)

{
  LY_ERR LVar1;
  long local_58;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR ret;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lysc_node *snode_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  LVar1 = lyb_read_start_siblings(lybctx->lybctx);
  while( true ) {
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (lybctx->lybctx->siblings == (lyd_lyb_sibling *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = *(long *)&lybctx->lybctx->siblings[-1].inner_chunks;
    }
    if (lybctx->lybctx->siblings[local_58 + -1].written == 0) break;
    LVar1 = lyb_parse_node_leaf(lybctx,parent,snode,first_p,parsed);
  }
  LVar1 = lyb_read_stop_siblings(lybctx->lybctx);
  return LVar1;
}

Assistant:

static LY_ERR
lyb_parse_node_leaflist(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, const struct lysc_node *snode,
        struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR ret;

    /* register a new sibling */
    ret = lyb_read_start_siblings(lybctx->lybctx);
    LY_CHECK_RET(ret);

    /* process all siblings */
    while (LYB_LAST_SIBLING(lybctx->lybctx).written) {
        ret = lyb_parse_node_leaf(lybctx, parent, snode, first_p, parsed);
        LY_CHECK_RET(ret);
    }

    /* end the sibling */
    ret = lyb_read_stop_siblings(lybctx->lybctx);
    LY_CHECK_RET(ret);

    return ret;
}